

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

void __thiscall ODDLParser::Reference::~Reference(Reference *this)

{
  Name *this_00;
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < this->m_numRefs; uVar1 = uVar1 + 1) {
    this_00 = this->m_referencedName[uVar1];
    if (this_00 != (Name *)0x0) {
      Name::~Name(this_00);
    }
    operator_delete(this_00,0x10);
  }
  this->m_numRefs = 0;
  if (this->m_referencedName != (Name **)0x0) {
    operator_delete__(this->m_referencedName);
  }
  this->m_referencedName = (Name **)0x0;
  return;
}

Assistant:

Reference::~Reference() {
    for (size_t i = 0; i < m_numRefs; i++) {
        delete m_referencedName[i];
    }
    m_numRefs = 0;
    delete[] m_referencedName;
    m_referencedName = nullptr;
}